

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Gia_DeriveFormula_rec(Gia_Man_t *pGia,char **ppNamesIn,Vec_Str_t *vStr,int iLit)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  size_t sVar3;
  char **__size;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  undefined8 uVar7;
  uint uVar8;
  char cVar9;
  char **format;
  char cVar10;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (pGia->nObjs <= (int)((uint)iLit >> 1)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar1 = pGia->pObjs + ((uint)iLit >> 1);
  uVar8 = iLit & 1;
  uVar7 = *(undefined8 *)pGVar1;
  if ((~(uint)uVar7 & 0x1fffffff) == 0 || (int)(uint)uVar7 < 0) {
    format = ppNamesIn;
    if (uVar8 != 0) {
      uVar8 = vStr->nSize;
      if (uVar8 == vStr->nCap) {
        if ((int)uVar8 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            format = (char **)&DAT_00000010;
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          __size = (char **)((ulong)uVar8 * 2);
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc((size_t)__size);
          }
          else {
            format = __size;
            pcVar6 = (char *)realloc(vStr->pArray,(size_t)__size);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)__size;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar4 = vStr->nSize;
      vStr->nSize = iVar4 + 1;
      pcVar6[iVar4] = '~';
      uVar7 = *(undefined8 *)pGVar1;
    }
    if (-1 < (int)uVar7) {
      __assert_fail("pObj->fTerm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
    }
    Vec_StrPrintF(vStr,(char *)format,
                  *(undefined8 *)((long)ppNamesIn + (ulong)(uint)((int)((ulong)uVar7 >> 0x20) << 3))
                 );
    return;
  }
  uVar5 = vStr->nSize;
  if (uVar5 == vStr->nCap) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar5 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar3);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar3);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar3;
    }
  }
  else {
    pcVar6 = vStr->pArray;
  }
  iVar4 = vStr->nSize;
  vStr->nSize = iVar4 + 1;
  pcVar6[iVar4] = '(';
  pGVar2 = pGia->pObjs;
  if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + pGia->nObjs)) {
    iVar4 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
    if ((pGia->pMuxes == (uint *)0x0) || (pGia->pMuxes[iVar4] == 0)) {
      iVar4 = iVar4 - (*(uint *)pGVar1 & 0x1fffffff);
      if (-1 < iVar4) {
        Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(*(uint *)pGVar1 >> 0x1d & 1) + iVar4 * 2 ^ uVar8)
        ;
        uVar5 = (uint)*(undefined8 *)pGVar1;
        if ((int)uVar5 < 0 || (~uVar5 & 0x1fffffff) == 0) {
          cVar10 = '|';
          if (uVar8 == 0) {
            cVar10 = '&';
          }
        }
        else {
          cVar9 = '|';
          if (uVar8 == 0) {
            cVar9 = '&';
          }
          cVar10 = '^';
          if (((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff) <= (uVar5 & 0x1fffffff)) {
            cVar10 = cVar9;
          }
        }
        uVar5 = vStr->nSize;
        if (uVar5 == vStr->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vStr->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(vStr->pArray,0x10);
            }
            vStr->pArray = pcVar6;
            vStr->nCap = 0x10;
          }
          else {
            sVar3 = (ulong)uVar5 * 2;
            if (vStr->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(sVar3);
            }
            else {
              pcVar6 = (char *)realloc(vStr->pArray,sVar3);
            }
            vStr->pArray = pcVar6;
            vStr->nCap = (int)sVar3;
          }
        }
        else {
          pcVar6 = vStr->pArray;
        }
        iVar4 = vStr->nSize;
        vStr->nSize = iVar4 + 1;
        pcVar6[iVar4] = cVar10;
        pGVar2 = pGia->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar1)) goto LAB_005924f1;
        uVar5 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
        iVar4 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 -
                (uVar5 & 0x1fffffff);
        if (-1 < iVar4) {
          uVar5 = (uVar5 >> 0x1d & 1) + iVar4 * 2;
LAB_0059245f:
          Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,uVar5 ^ uVar8);
          uVar8 = vStr->nSize;
          if (uVar8 == vStr->nCap) {
            if ((int)uVar8 < 0x10) {
              if (vStr->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(vStr->pArray,0x10);
              }
              vStr->pArray = pcVar6;
              vStr->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar8 * 2;
              if (vStr->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar3);
              }
              else {
                pcVar6 = (char *)realloc(vStr->pArray,sVar3);
              }
              vStr->pArray = pcVar6;
              vStr->nCap = (int)sVar3;
            }
          }
          else {
            pcVar6 = vStr->pArray;
          }
          iVar4 = vStr->nSize;
          vStr->nSize = iVar4 + 1;
          pcVar6[iVar4] = ')';
          return;
        }
      }
    }
    else {
      iVar4 = iVar4 - (*(uint *)pGVar1 & 0x1fffffff);
      if (-1 < iVar4) {
        Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(*(uint *)pGVar1 >> 0x1d & 1) + iVar4 * 2);
        uVar5 = vStr->nSize;
        if (uVar5 == vStr->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vStr->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(vStr->pArray,0x10);
            }
            vStr->pArray = pcVar6;
            vStr->nCap = 0x10;
          }
          else {
            sVar3 = (ulong)uVar5 * 2;
            if (vStr->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(sVar3);
            }
            else {
              pcVar6 = (char *)realloc(vStr->pArray,sVar3);
            }
            vStr->pArray = pcVar6;
            vStr->nCap = (int)sVar3;
          }
        }
        else {
          pcVar6 = vStr->pArray;
        }
        iVar4 = vStr->nSize;
        vStr->nSize = iVar4 + 1;
        pcVar6[iVar4] = '?';
        pGVar2 = pGia->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar1)) goto LAB_005924f1;
        uVar5 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
        iVar4 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555 -
                (uVar5 & 0x1fffffff);
        if (-1 < iVar4) {
          Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,(uVar5 >> 0x1d & 1) + iVar4 * 2 ^ uVar8);
          uVar5 = vStr->nSize;
          if (uVar5 == vStr->nCap) {
            if ((int)uVar5 < 0x10) {
              if (vStr->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(vStr->pArray,0x10);
              }
              vStr->pArray = pcVar6;
              vStr->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar5 * 2;
              if (vStr->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar3);
              }
              else {
                pcVar6 = (char *)realloc(vStr->pArray,sVar3);
              }
              vStr->pArray = pcVar6;
              vStr->nCap = (int)sVar3;
            }
          }
          else {
            pcVar6 = vStr->pArray;
          }
          iVar4 = vStr->nSize;
          vStr->nSize = iVar4 + 1;
          pcVar6[iVar4] = ':';
          if (pGia->pMuxes != (uint *)0x0) {
            pGVar2 = pGia->pObjs;
            if ((pGVar1 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar1)) goto LAB_005924f1;
            uVar5 = pGia->pMuxes[(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555];
            if (0 < (int)uVar5) goto LAB_0059245f;
          }
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
      }
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_005924f1:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_DeriveFormula_rec( Gia_Man_t * pGia, char ** ppNamesIn, Vec_Str_t * vStr, int iLit )
{
    Gia_Obj_t * pObj = Gia_ManObj( pGia, Abc_Lit2Var(iLit) );
    int fCompl = Abc_LitIsCompl(iLit);
    if ( Gia_ObjIsAnd(pObj) )
    {
        Vec_StrPush( vStr, '(' );
        if ( Gia_ObjIsMux(pGia, pObj) )
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Gia_ObjFaninLit0p(pGia, pObj) );
            Vec_StrPush( vStr, '?' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, ':' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit2p(pGia, pObj), fCompl ) );
        }
        else
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit0p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, (char)(Gia_ObjIsXor(pObj) ? '^' : (char)(fCompl ? '|' : '&')) );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
        }
        Vec_StrPush( vStr, ')' );
    }
    else
    {
        if ( fCompl ) Vec_StrPush( vStr, '~' );
        Vec_StrPrintF( vStr, "%s", ppNamesIn[Gia_ObjCioId(pObj)] );
    }
}